

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Chapters::Edition::Parse(Edition *this,IMkvReader *pReader,longlong pos,longlong size)

{
  long lVar1;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong size_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  Edition *this_local;
  
  id = pos + size;
  stop = size;
  size_local = pos;
  pos_local = (longlong)pReader;
  pReader_local = (IMkvReader *)this;
  while( true ) {
    if (id <= size_local) {
      if (size_local != id) {
        return -2;
      }
      return 0;
    }
    lVar1 = ParseElementHeader((IMkvReader *)pos_local,&size_local,id,&size_1,&status);
    if (lVar1 < 0) break;
    if (status != 0) {
      if ((size_1 == 0xb6) &&
         (lVar1 = ParseAtom(this,(IMkvReader *)pos_local,size_local,status), lVar1 < 0)) {
        return lVar1;
      }
      size_local = status + size_local;
      if (id < size_local) {
        return -2;
      }
    }
  }
  return lVar1;
}

Assistant:

long Chapters::Edition::Parse(IMkvReader* pReader, long long pos,
                              long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)
      continue;

    if (id == libwebm::kMkvChapterAtom) {
      status = ParseAtom(pReader, pos, size);

      if (status < 0)  // error
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}